

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O2

int gray_raster_new(FT_Memory memory,gray_PRaster *araster)

{
  gray_PRaster pgVar1;
  FT_Error error;
  
  pgVar1 = (gray_PRaster)ft_mem_alloc(memory,8,&error);
  if (error == 0) {
    pgVar1->memory = memory;
  }
  *araster = pgVar1;
  return error;
}

Assistant:

static int
  gray_raster_new( FT_Memory      memory,
                   gray_PRaster*  araster )
  {
    FT_Error      error;
    gray_PRaster  raster = NULL;


    if ( !FT_NEW( raster ) )
      raster->memory = memory;

    *araster = raster;

    return error;
  }